

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

ssize_t strhex_to_bin(uint8_t *buffer,size_t buffer_len,char *src)

{
  int8_t iVar1;
  byte bVar2;
  size_t sVar3;
  long lVar4;
  int8_t v2;
  uint8_t *puStack_40;
  int8_t v1;
  size_t j;
  size_t i;
  size_t srclen;
  char *src_local;
  size_t buffer_len_local;
  uint8_t *buffer_local;
  
  sVar3 = strlen(src);
  if (((sVar3 & 1) == 0) && (sVar3 >> 1 <= buffer_len)) {
    j = 0;
    puStack_40 = (uint8_t *)0x0;
    while (j < sVar3) {
      lVar4 = j + 1;
      iVar1 = _hexchar_to_value(src[j]);
      j = j + 2;
      bVar2 = _hexchar_to_value(src[lVar4]);
      if ((iVar1 < '\0') || ((char)bVar2 < '\0')) {
        return -1;
      }
      buffer[(long)puStack_40] = iVar1 << 4 | bVar2;
      puStack_40 = puStack_40 + 1;
    }
    buffer_local = puStack_40;
  }
  else {
    buffer_local = (uint8_t *)0xffffffffffffffff;
  }
  return (ssize_t)buffer_local;
}

Assistant:

ssize_t
strhex_to_bin(uint8_t *buffer, size_t buffer_len, const char *src) {
  size_t srclen, i, j;
  int8_t v1, v2;
  srclen = strlen(src);
  if ((srclen & 1) != 0 || buffer_len < srclen/2) {
    return -1;
  }

  for (i=0, j=0; i<srclen; j++) {
    v1 = _hexchar_to_value(src[i++]);
    v2 = _hexchar_to_value(src[i++]);

    if (v1 < 0 || v2 < 0) {
      return -1;
    }
    buffer[j] = (v1 << 4) | v2;
  }
  return j;
}